

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

void unroll(lua_State *L,void *ud)

{
  void *ud_local;
  lua_State *L_local;
  
  if (ud != (void *)0x0) {
    finishCcall(L,*ud);
  }
  while (L->ci != &L->base_ci) {
    if ((L->ci->callstatus & 2) == 0) {
      finishCcall(L,1);
    }
    else {
      luaV_finishOp(L);
      luaV_execute(L);
    }
  }
  return;
}

Assistant:

static void unroll (lua_State *L, void *ud) {
  CallInfo *ci;
  if (ud != NULL)  /* error status? */
    finishCcall(L, *(int *)ud);  /* finish 'lua_pcallk' callee */
  while ((ci = L->ci) != &L->base_ci) {  /* something in the stack */
    if (!isLua(ci))  /* C function? */
      finishCcall(L, LUA_YIELD);  /* complete its execution */
    else {  /* Lua function */
      luaV_finishOp(L);  /* finish interrupted instruction */
      luaV_execute(L, ci);  /* execute down to higher C 'boundary' */
    }
  }
}